

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::contains
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  uint uVar1;
  byte in_AL;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = this->bucketCount;
  if (uVar1 != 0) {
    uVar2 = (*key)->nameHash & uVar1 - 1;
    uVar3 = 1;
    do {
      if (this->data[uVar2] == (TypeBase *)0x0) {
        bVar4 = false;
        in_AL = 0;
      }
      else if (this->data[uVar2] == *key) {
        in_AL = 1;
        bVar4 = false;
      }
      else {
        uVar2 = uVar2 + uVar3 & uVar1 - 1;
        bVar4 = true;
      }
      if (!bVar4) goto LAB_00191646;
      bVar4 = uVar3 != uVar1;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  in_AL = 0;
LAB_00191646:
  return (bool)(in_AL & 1);
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}